

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamEncoder.cpp
# Opt level: O2

bool generate_special(TrackData *trackdata)

{
  bool bVar1;
  Track *pTVar2;
  int weak_size;
  int weak_offset;
  Track track;
  int local_f0;
  int local_ec;
  Track local_e8;
  TrackData local_c8;
  
  pTVar2 = TrackData::track(trackdata);
  Track::Track(&local_e8,pTVar2);
  local_ec = 0;
  local_f0 = 0;
  bVar1 = IsEmptyTrack(&local_e8);
  if (bVar1) {
    GenerateEmptyTrack(&local_c8,&trackdata->cylhead,&local_e8);
    TrackData::add(trackdata,&local_c8);
  }
  else {
    bVar1 = IsKBI19Track(&local_e8);
    if (bVar1) {
      GenerateKBI19Track(&local_c8,&trackdata->cylhead,&local_e8);
      TrackData::add(trackdata,&local_c8);
    }
    else {
      bVar1 = IsSystem24Track(&local_e8);
      if (bVar1) {
        GenerateSystem24Track(&local_c8,&trackdata->cylhead,&local_e8);
        TrackData::add(trackdata,&local_c8);
      }
      else {
        bVar1 = IsSpectrumSpeedlockTrack(&local_e8,&local_ec,&local_f0);
        if (bVar1) {
          GenerateSpectrumSpeedlockTrack(&local_c8,&trackdata->cylhead,&local_e8,local_ec,local_f0);
          TrackData::add(trackdata,&local_c8);
        }
        else {
          bVar1 = IsCpcSpeedlockTrack(&local_e8,&local_ec,&local_f0);
          if (bVar1) {
            GenerateCpcSpeedlockTrack(&local_c8,&trackdata->cylhead,&local_e8,local_ec,local_f0);
            TrackData::add(trackdata,&local_c8);
          }
          else {
            bVar1 = IsRainbowArtsTrack(&local_e8,&local_ec,&local_f0);
            if (bVar1) {
              GenerateRainbowArtsTrack(&local_c8,&trackdata->cylhead,&local_e8,local_ec,local_f0);
              TrackData::add(trackdata,&local_c8);
            }
            else {
              bVar1 = IsKBIWeakSectorTrack(&local_e8,&local_ec,&local_f0);
              if (bVar1) {
                GenerateKBIWeakSectorTrack
                          (&local_c8,&trackdata->cylhead,&local_e8,local_ec,local_f0);
                TrackData::add(trackdata,&local_c8);
              }
              else {
                bVar1 = IsLogoProfTrack(&local_e8);
                if (bVar1) {
                  GenerateLogoProfTrack(&local_c8,&trackdata->cylhead,&local_e8);
                  TrackData::add(trackdata,&local_c8);
                }
                else {
                  bVar1 = IsOperaSoftTrack(&local_e8);
                  if (bVar1) {
                    GenerateOperaSoftTrack(&local_c8,&trackdata->cylhead,&local_e8);
                    TrackData::add(trackdata,&local_c8);
                  }
                  else {
                    bVar1 = Is8KSectorTrack(&local_e8);
                    if (bVar1) {
                      Generate8KSectorTrack(&local_c8,&trackdata->cylhead,&local_e8);
                      TrackData::add(trackdata,&local_c8);
                    }
                    else {
                      bVar1 = Is11SectorTrack(&local_e8);
                      if (!bVar1) {
                        bVar1 = false;
                        goto LAB_00150539;
                      }
                      Generate11SectorTrack(&local_c8,&trackdata->cylhead,&local_e8);
                      TrackData::add(trackdata,&local_c8);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  TrackData::~TrackData(&local_c8);
  bVar1 = true;
LAB_00150539:
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_e8.m_sectors);
  return bVar1;
}

Assistant:

bool generate_special(TrackData& trackdata)
{
    auto track{ trackdata.track() };
    int weak_offset{ 0 }, weak_size{ 0 };

    // Special formats have special conversions
    if (IsEmptyTrack(track))
        trackdata.add(GenerateEmptyTrack(trackdata.cylhead, track));
    else if (IsKBI19Track(track))
        trackdata.add(GenerateKBI19Track(trackdata.cylhead, track));
    else if (IsSystem24Track(track))
        trackdata.add(GenerateSystem24Track(trackdata.cylhead, track));
    else if (IsSpectrumSpeedlockTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateSpectrumSpeedlockTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsCpcSpeedlockTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateCpcSpeedlockTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsRainbowArtsTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateRainbowArtsTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsKBIWeakSectorTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateKBIWeakSectorTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsLogoProfTrack(track))
        trackdata.add(GenerateLogoProfTrack(trackdata.cylhead, track));
    else if (IsOperaSoftTrack(track))
        trackdata.add(GenerateOperaSoftTrack(trackdata.cylhead, track));
    else if (Is8KSectorTrack(track))
        trackdata.add(Generate8KSectorTrack(trackdata.cylhead, track));
    else if (Is11SectorTrack(track))
        trackdata.add(Generate11SectorTrack(trackdata.cylhead, track));
    else
        return false;

    return true;
}